

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

void __thiscall deqp::gles31::Functional::anon_unknown_1::TessCoordCase::deinit(TessCoordCase *this)

{
  TessCoordCase *this_local;
  
  de::SharedPtr<const_glu::ShaderProgram>::clear(&this->m_program);
  return;
}

Assistant:

void TessCoordCase::deinit (void)
{
	m_program.clear();
}